

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *eps2,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  int iVar2;
  fpclass_type fVar3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  bool bVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  int local_480;
  bool local_479;
  int *local_478;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_470;
  int *local_468;
  int32_t local_45c;
  int *local_458;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_450;
  int *local_448;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_88.m_backend.exp = (eps->m_backend).exp;
  local_88.m_backend.neg = (eps->m_backend).neg;
  local_88.m_backend.fpclass = (eps->m_backend).fpclass;
  local_88.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
  local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
  local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
  local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
  local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
  local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
  local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
  local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
  local_d8.m_backend.exp = (eps2->m_backend).exp;
  local_d8.m_backend.neg = (eps2->m_backend).neg;
  local_d8.m_backend.fpclass = (eps2->m_backend).fpclass;
  local_d8.m_backend.prec_elem = (eps2->m_backend).prec_elem;
  local_478 = ridx;
  local_470 = eps;
  local_450 = vec;
  local_448 = idx;
  vSolveLright2(this,rhs,ridx,rn,&local_88,rhs2,ridx2,rn2,&local_d8);
  piVar7 = local_478;
  local_468 = (this->row).perm;
  local_480 = 0;
  local_440 = this;
  if (forest == (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x0) {
    for (lVar8 = 0; lVar8 < *rn; lVar8 = lVar8 + 1) {
      iVar6 = piVar7[lVar8];
      local_2b8.m_backend.exp = rhs[iVar6].m_backend.exp;
      local_2b8.m_backend.neg = rhs[iVar6].m_backend.neg;
      local_2b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar6].m_backend.data._M_elems;
      local_2b8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs[iVar6].m_backend.data._M_elems + 2);
      puVar1 = rhs[iVar6].m_backend.data._M_elems + 4;
      local_2b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_2b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[iVar6].m_backend.data._M_elems + 8;
      local_2b8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_2b8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[iVar6].m_backend.data._M_elems + 0xc;
      local_2b8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_2b8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_2b8.m_backend.fpclass = rhs[iVar6].m_backend.fpclass;
      local_2b8.m_backend.prec_elem = rhs[iVar6].m_backend.prec_elem;
      local_308.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_470->m_backend).data._M_elems;
      local_308.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_470->m_backend).data._M_elems + 2);
      local_308.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_470->m_backend).data._M_elems + 4);
      local_308.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_470->m_backend).data._M_elems + 6);
      local_308.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_470->m_backend).data._M_elems + 8);
      local_308.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((local_470->m_backend).data._M_elems + 10);
      local_308.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((local_470->m_backend).data._M_elems + 0xc);
      local_308.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((local_470->m_backend).data._M_elems + 0xe);
      local_308.m_backend.exp = (local_470->m_backend).exp;
      local_308.m_backend.neg = (local_470->m_backend).neg;
      local_308.m_backend.fpclass = (local_470->m_backend).fpclass;
      local_308.m_backend.prec_elem = (local_470->m_backend).prec_elem;
      bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_2b8,&local_308);
      if (bVar5) {
        enQueueMax(piVar7,&local_480,local_468[iVar6]);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (&rhs[iVar6].m_backend,0);
      }
    }
    *rn = local_480;
  }
  else {
    local_458 = forestIdx;
    for (lVar8 = 0; lVar8 < *rn; lVar8 = lVar8 + 1) {
      iVar6 = piVar7[lVar8];
      local_438 = *(undefined8 *)rhs[iVar6].m_backend.data._M_elems;
      uStack_430 = *(undefined8 *)(rhs[iVar6].m_backend.data._M_elems + 2);
      puVar1 = rhs[iVar6].m_backend.data._M_elems + 4;
      local_428 = *(undefined8 *)puVar1;
      uStack_420 = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[iVar6].m_backend.data._M_elems + 8;
      local_418 = *(undefined8 *)puVar1;
      uStack_410 = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[iVar6].m_backend.data._M_elems + 0xc;
      local_408 = *(undefined8 *)puVar1;
      uStack_400 = *(undefined8 *)(puVar1 + 2);
      iVar2 = rhs[iVar6].m_backend.exp;
      local_479 = rhs[iVar6].m_backend.neg;
      fVar3 = rhs[iVar6].m_backend.fpclass;
      local_45c = rhs[iVar6].m_backend.prec_elem;
      local_3f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar6].m_backend.data._M_elems;
      local_3f8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs[iVar6].m_backend.data._M_elems + 2);
      puVar1 = rhs[iVar6].m_backend.data._M_elems + 4;
      local_3f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_3f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[iVar6].m_backend.data._M_elems + 8;
      local_3f8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_3f8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[iVar6].m_backend.data._M_elems + 0xc;
      local_3f8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_3f8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_470->m_backend).data._M_elems;
      local_268.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_470->m_backend).data._M_elems + 2);
      local_268.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_470->m_backend).data._M_elems + 4);
      local_268.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_470->m_backend).data._M_elems + 6);
      local_268.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_470->m_backend).data._M_elems + 8);
      local_268.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((local_470->m_backend).data._M_elems + 10);
      local_268.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((local_470->m_backend).data._M_elems + 0xc);
      local_268.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((local_470->m_backend).data._M_elems + 0xe);
      local_268.m_backend.exp = (local_470->m_backend).exp;
      local_268.m_backend.neg = (local_470->m_backend).neg;
      local_268.m_backend.fpclass = (local_470->m_backend).fpclass;
      local_268.m_backend.prec_elem = (local_470->m_backend).prec_elem;
      local_3f8.m_backend.exp = iVar2;
      local_3f8.m_backend.neg = local_479;
      local_3f8.m_backend.fpclass = fVar3;
      local_3f8.m_backend.prec_elem = local_45c;
      bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_3f8,&local_268);
      piVar7 = local_478;
      if (bVar5) {
        *local_458 = iVar6;
        local_458 = local_458 + 1;
        enQueueMax(local_478,&local_480,local_468[iVar6]);
        puVar1 = forest[iVar6].m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar1 = local_408;
        *(undefined8 *)(puVar1 + 2) = uStack_400;
        puVar1 = forest[iVar6].m_backend.data._M_elems + 8;
        *(undefined8 *)puVar1 = local_418;
        *(undefined8 *)(puVar1 + 2) = uStack_410;
        puVar1 = forest[iVar6].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = local_428;
        *(undefined8 *)(puVar1 + 2) = uStack_420;
        *(undefined8 *)forest[iVar6].m_backend.data._M_elems = local_438;
        *(undefined8 *)(forest[iVar6].m_backend.data._M_elems + 2) = uStack_430;
        forest[iVar6].m_backend.exp = iVar2;
        forest[iVar6].m_backend.neg = local_479;
        forest[iVar6].m_backend.fpclass = fVar3;
        forest[iVar6].m_backend.prec_elem = local_45c;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (&rhs[iVar6].m_backend,0);
        piVar7 = local_478;
      }
    }
    *rn = local_480;
    *forestNum = local_480;
  }
  local_480 = 0;
  for (lVar8 = 0; this_00 = local_440, piVar7 = local_448, vec_00 = local_450, pnVar4 = local_470,
      lVar8 < *rn2; lVar8 = lVar8 + 1) {
    iVar6 = ridx2[lVar8];
    local_358.m_backend.exp = rhs2[iVar6].m_backend.exp;
    local_358.m_backend.neg = rhs2[iVar6].m_backend.neg;
    local_358.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs2[iVar6].m_backend.data._M_elems;
    local_358.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(rhs2[iVar6].m_backend.data._M_elems + 2);
    puVar1 = rhs2[iVar6].m_backend.data._M_elems + 4;
    local_358.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_358.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = rhs2[iVar6].m_backend.data._M_elems + 8;
    local_358.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_358.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = rhs2[iVar6].m_backend.data._M_elems + 0xc;
    local_358.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_358.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_358.m_backend.fpclass = rhs2[iVar6].m_backend.fpclass;
    local_358.m_backend.prec_elem = rhs2[iVar6].m_backend.prec_elem;
    local_3a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
    local_3a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
    local_3a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
    local_3a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
    local_3a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
    local_3a8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10)
    ;
    local_3a8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
    local_3a8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
    local_3a8.m_backend.exp = (eps2->m_backend).exp;
    local_3a8.m_backend.neg = (eps2->m_backend).neg;
    local_3a8.m_backend.fpclass = (eps2->m_backend).fpclass;
    local_3a8.m_backend.prec_elem = (eps2->m_backend).prec_elem;
    bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_358,&local_3a8);
    if (bVar5) {
      enQueueMax(ridx2,&local_480,local_468[iVar6]);
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&rhs2[iVar6].m_backend,0);
    }
  }
  *rn2 = local_480;
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_470->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((local_470->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((local_470->m_backend).data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((local_470->m_backend).data._M_elems + 6);
  local_128.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((local_470->m_backend).data._M_elems + 8);
  local_128.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)((local_470->m_backend).data._M_elems + 10);
  local_128.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)((local_470->m_backend).data._M_elems + 0xc);
  local_128.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)((local_470->m_backend).data._M_elems + 0xe);
  local_128.m_backend.exp = (local_470->m_backend).exp;
  local_128.m_backend.neg = (local_470->m_backend).neg;
  local_128.m_backend.fpclass = (local_470->m_backend).fpclass;
  local_128.m_backend.prec_elem = (local_470->m_backend).prec_elem;
  iVar6 = vSolveUright(local_440,local_450,local_448,rhs,local_478,*rn,&local_128);
  *rn = iVar6;
  local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
  local_178.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
  local_178.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
  local_178.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
  local_178.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
  local_178.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
  local_178.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
  local_178.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
  local_178.m_backend.exp = (eps2->m_backend).exp;
  local_178.m_backend.neg = (eps2->m_backend).neg;
  local_178.m_backend.fpclass = (eps2->m_backend).fpclass;
  local_178.m_backend.prec_elem = (eps2->m_backend).prec_elem;
  iVar6 = vSolveUright(this_00,vec2,idx2,rhs2,ridx2,*rn2,&local_178);
  *rn2 = iVar6;
  if ((this_00->l).updateType == 0) {
    local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    local_1c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 2)
    ;
    local_1c8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((pnVar4->m_backend).data._M_elems + 4);
    local_1c8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((pnVar4->m_backend).data._M_elems + 6);
    local_1c8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pnVar4->m_backend).data._M_elems + 8);
    local_1c8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((pnVar4->m_backend).data._M_elems + 10);
    local_1c8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((pnVar4->m_backend).data._M_elems + 0xc);
    local_1c8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((pnVar4->m_backend).data._M_elems + 0xe);
    local_1c8.m_backend.exp = (pnVar4->m_backend).exp;
    local_1c8.m_backend.neg = (pnVar4->m_backend).neg;
    local_1c8.m_backend.fpclass = (pnVar4->m_backend).fpclass;
    local_1c8.m_backend.prec_elem = (pnVar4->m_backend).prec_elem;
    iVar6 = vSolveUpdateRight(this_00,vec_00,piVar7,*rn,&local_1c8);
    *rn = iVar6;
    local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
    local_218.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
    local_218.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
    local_218.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
    local_218.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
    local_218.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10)
    ;
    local_218.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
    local_218.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
    local_218.m_backend.exp = (eps2->m_backend).exp;
    local_218.m_backend.neg = (eps2->m_backend).neg;
    local_218.m_backend.fpclass = (eps2->m_backend).fpclass;
    local_218.m_backend.prec_elem = (eps2->m_backend).prec_elem;
    iVar6 = vSolveUpdateRight(this_00,vec2,idx2,*rn2,&local_218);
    *rn2 = iVar6;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update2sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R* forest, int* forestNum, int* forestIdx)
{
   /* solve with L */
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap for both ridx and ridx2 */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   /* solve with U */
   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
   }
}